

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  Value *root_local;
  OStream *out_local;
  StyledStreamWriter *this_local;
  
  this->document_ = (OStream *)CONCAT44(in_register_00000034,__fd);
  this->field_0x68 = this->field_0x68 & 0xfe;
  std::__cxx11::string::clear();
  this->field_0x68 = this->field_0x68 & 0xfd | 2;
  writeCommentBeforeValue(this,(Value *)__buf);
  if (((byte)this->field_0x68 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  this->field_0x68 = this->field_0x68 & 0xfd | 2;
  writeValue(this,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this,(Value *)__buf);
  std::operator<<(this->document_,"\n");
  this->document_ = (OStream *)0x0;
  return (ssize_t)this;
}

Assistant:

void StyledStreamWriter::write(OStream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_.clear();
  indented_ = true;
  writeCommentBeforeValue(root);
  if (!indented_)
    writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = nullptr; // Forget the stream, for safety.
}